

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.hpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo::GLSLStubInfo
          (GLSLStubInfo *this,String *_Name,char *_Swizzle)

{
  allocator local_11;
  
  std::__cxx11::string::string((string *)this,(string *)_Name);
  std::__cxx11::string::string((string *)&this->Swizzle,_Swizzle,&local_11);
  return;
}

Assistant:

GLSLStubInfo(const String& _Name, const char* _Swizzle) :
            Name{_Name},
            Swizzle{_Swizzle}
        {}